

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_stethoscope(obj *obj)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  obj *poVar5;
  bool bVar6;
  monst *local_50;
  char *local_48;
  bool local_3a;
  char local_37;
  char local_36;
  char local_35;
  uint local_34;
  boolean interference;
  schar dz;
  schar dy;
  schar dx;
  int res;
  int ry;
  int rx;
  rm *loc;
  monst *mtmp;
  obj *obj_local;
  
  bVar6 = false;
  mtmp = (monst *)obj;
  if (((u._1052_1_ & 1) != 0) &&
     (((u.ustuck)->data->mlet == '\x16' || (bVar6 = false, (u.ustuck)->data == mons + 0x9f)))) {
    iVar3 = 3;
    if (urole.malenum == 0x15e) {
      iVar3 = 10;
    }
    iVar3 = rn2(iVar3);
    bVar6 = iVar3 == 0;
  }
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pline("You have no hands!");
    return 0;
  }
  iVar3 = freehand();
  if (iVar3 == 0) {
    pcVar4 = body_part(6);
    pline("You have no free %s.",pcVar4);
    return 0;
  }
  iVar3 = getdir((char *)0x0,&local_35,&local_36,&local_37);
  if (iVar3 == 0) {
    return 0;
  }
  local_3a = moves == stetho_last_used_move && youmonst.movement == stetho_last_used_movement;
  local_34 = (uint)local_3a;
  stetho_last_used_move = moves;
  stetho_last_used_movement = (int)youmonst.movement;
  if ((u.usteed != (monst *)0x0) && ('\0' < local_37)) {
    if (bVar6) {
      pcVar4 = Monnam(u.ustuck);
      pline("%s interferes.",pcVar4);
      mstatusline(u.ustuck);
    }
    else {
      mstatusline(u.usteed);
    }
    return local_34;
  }
  if (((u._1052_1_ & 1) != 0) && (((local_35 != '\0' || (local_36 != '\0')) || (local_37 != '\0'))))
  {
    mstatusline(u.ustuck);
    return local_34;
  }
  if (((u._1052_1_ & 1) != 0) && (bVar6)) {
    pcVar4 = Monnam(u.ustuck);
    pline("%s interferes.",pcVar4);
    mstatusline(u.ustuck);
    return local_34;
  }
  if (local_37 != '\0') {
    if (((byte)u._1052_1_ >> 1 & 1) == 0) {
      if ((local_37 < '\0') || (bVar1 = can_reach_floor(), bVar1 == '\0')) {
        if (local_37 < '\x01') {
          local_48 = ceiling((int)u.ux,(int)u.uy);
        }
        else {
          local_48 = surface((int)u.ux,(int)u.uy);
        }
        pline("You can\'t reach the %s.",local_48);
      }
      else {
        bVar1 = its_dead((int)u.ux,(int)u.uy,(int *)&local_34,(obj *)mtmp);
        if (bVar1 == '\0') {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
          if (bVar1 == '\0') {
            pcVar4 = surface((int)u.ux,(int)u.uy);
            pline("The %s seems healthy enough.",pcVar4);
          }
          else {
            You_hear("the crackling of hellfire.");
          }
        }
      }
    }
    else {
      You_hear("faint splashing.");
    }
    return local_34;
  }
  if (((*(uint *)(mtmp->mtrack + 3) & 1) != 0) && (iVar3 = rn2(2), iVar3 == 0)) {
    You_hear("your heart beat.");
    return local_34;
  }
  if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c')
      ) || ((u.uprops[0x1c].intrinsic != 0 && (iVar3 = rn2(5), iVar3 == 0)))) {
    confdir(&local_35,&local_36);
  }
  if ((local_35 == '\0') && (local_36 == '\0')) {
    ustatusline();
    return local_34;
  }
  res = (int)u.ux + (int)local_35;
  _interference = (int)u.uy + (int)local_36;
  if ((((res < 1) || (0x4f < res)) || (_interference < 0)) || (0x14 < _interference)) {
    You_hear("a faint typing noise.");
    return 0;
  }
  if ((level->monsters[res][_interference] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[res][_interference]->field_0x60 >> 9 & 1) != 0)) {
    local_50 = (monst *)0x0;
  }
  else {
    local_50 = level->monsters[res][_interference];
  }
  loc = (rm *)local_50;
  if (local_50 == (monst *)0x0) {
    if ((*(uint *)&level->locations[res][_interference].field_0x6 >> 3 & 1) != 0) {
      unmap_object(res,_interference);
      newsym(res,_interference);
      pline("The invisible monster must have moved.");
    }
    _ry = level->locations[res] + _interference;
    if (_ry->typ != '\x0f') {
      if (_ry->typ != '\x10') {
        bVar1 = its_dead(res,_interference,(int *)&local_34,(obj *)mtmp);
        if (bVar1 == '\0') {
          pline("You hear nothing special.");
        }
        return local_34;
      }
      You_hear("a hollow sound.  This must be a secret %s!","passage");
      _ry->typ = '\x18';
      unblock_point(res,_interference);
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        newsym(res,_interference);
      }
      else {
        feel_location((xchar)res,(xchar)_interference);
      }
      return local_34;
    }
    You_hear("a hollow sound.  This must be a secret %s!","door");
    cvt_sdoor_to_door(_ry,&u.uz);
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      newsym(res,_interference);
    }
    else {
      feel_location((xchar)res,(xchar)_interference);
    }
    return local_34;
  }
  mstatusline(local_50);
  if (((*(uint *)(loc + 8) >> 7 & 1) != 0) &&
     (*(uint *)(loc + 8) = *(uint *)(loc + 8) & 0xffffff7f,
     (viz_array[_interference][res] & 2U) != 0)) {
    newsym((int)(char)loc[6].field_0x7,(int)(char)loc[6].field_0x8);
  }
  if (loc[8].seenv == '\0') {
    if ((viz_array[(char)loc[6].field_0x8][(char)loc[6].field_0x7] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((*(ushort *)(*(long *)&loc->field_0x8 + 0x38) & 0x200) == 0)))) goto LAB_0014f6d3;
      bVar2 = viz_array[(char)loc[6].field_0x8][(char)loc[6].field_0x7] & 1;
      goto joined_r0x0014f640;
    }
  }
  else {
    bVar2 = worm_known(level,(monst *)loc);
joined_r0x0014f640:
    if (bVar2 == 0) goto LAB_0014f6d3;
  }
  if (((((((*(uint *)(loc + 8) >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
        (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
      (((*(uint *)(loc + 8) >> 7 & 1) == 0 && ((*(uint *)(loc + 8) >> 9 & 1) == 0)))) &&
     (((byte)u._1052_1_ >> 5 & 1) == 0)) {
    return local_34;
  }
LAB_0014f6d3:
  if (((((*(uint *)(*(long *)&loc->field_0x8 + 0x30) & 0x10000) != 0) ||
       ((poVar5 = which_armor((monst *)loc,4), poVar5 != (obj *)0x0 &&
        (poVar5 = which_armor((monst *)loc,4), poVar5->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
        (((((u.uprops[0x19].intrinsic == 0 &&
            ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
           (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
         (u.uprops[0x19].blocked != 0)))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)(char)loc[6].field_0x7,(int)(char)loc[6].field_0x8,(int)u.ux,(int)u.uy),
        0x40 < iVar3)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar1 = match_warn_of_mon((monst *)loc), bVar1 == '\0')))) {
    map_invisible((xchar)res,(xchar)_interference);
  }
  return local_34;
}

Assistant:

static int use_stethoscope(struct obj *obj)
{
	struct monst *mtmp;
	struct rm *loc;
	int rx, ry, res;
	schar dx, dy, dz;
	boolean interference = (u.uswallow && is_whirly(u.ustuck->data) &&
				!rn2(Role_if (PM_HEALER) ? 10 : 3));

	if (nohands(youmonst.data)) {	/* should also check for no ears and/or deaf */
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}
	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;

	res = (moves == stetho_last_used_move) &&
	      (youmonst.movement == stetho_last_used_movement);
	stetho_last_used_move = moves;
	stetho_last_used_movement = youmonst.movement;

	if (u.usteed && dz > 0) {
		if (interference) {
			pline("%s interferes.", Monnam(u.ustuck));
			mstatusline(u.ustuck);
		} else
			mstatusline(u.usteed);
		return res;
	} else if (u.uswallow && (dx || dy || dz)) {
		mstatusline(u.ustuck);
		return res;
	} else if (u.uswallow && interference) {
		pline("%s interferes.", Monnam(u.ustuck));
		mstatusline(u.ustuck);
		return res;
	} else if (dz) {
		if (Underwater)
		    You_hear("faint splashing.");
		else if (dz < 0 || !can_reach_floor())
		    pline("You can't reach the %s.",
			(dz > 0) ? surface(u.ux, u.uy) : ceiling(u.ux, u.uy));
		else if (its_dead(u.ux, u.uy, &res, obj))
		    ;	/* message already given */
		else if (Is_stronghold(&u.uz))
		    You_hear("the crackling of hellfire.");
		else
		    pline("The %s seems healthy enough.", surface(u.ux, u.uy));
		return res;
	} else if (obj->cursed && !rn2(2)) {
		You_hear("your heart beat.");
		return res;
	}
	if (Stunned || (Confusion && !rn2(5)))
	    confdir(&dx, &dy);
	if (!dx && !dy) {
		ustatusline();
		return res;
	}
	
	rx = u.ux + dx;
	ry = u.uy + dy;
	if (!isok(rx, ry)) {
		You_hear("a faint typing noise.");
		return 0;
	}
	if ((mtmp = m_at(level, rx, ry)) != 0) {
		mstatusline(mtmp);
		if (mtmp->mundetected) {
			mtmp->mundetected = 0;
			if (cansee(rx, ry)) newsym(mtmp->mx, mtmp->my);
		}
		if (!canspotmon(level, mtmp))
			map_invisible(rx, ry);
		return res;
	}
	if (level->locations[rx][ry].mem_invis) {
		unmap_object(rx, ry);
		newsym(rx, ry);
		pline("The invisible monster must have moved.");
	}
	loc = &level->locations[rx][ry];
	switch(loc->typ) {
	case SDOOR:
		You_hear(hollow_str, "door");
		cvt_sdoor_to_door(loc, &u.uz);		/* ->typ = DOOR */
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	case SCORR:
		You_hear(hollow_str, "passage");
		loc->typ = CORR;
		unblock_point(rx,ry);
		if (Blind) feel_location(rx,ry);
		else newsym(rx,ry);
		return res;
	}

	if (!its_dead(rx, ry, &res, obj))
	    pline("You hear nothing special.");	/* not You_hear()  */
	return res;
}